

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

bool __thiscall
TPZMatrix<std::complex<float>_>::SolveEigensystemJacobi
          (TPZMatrix<std::complex<float>_> *this,int64_t *numiterations,REAL *tol,
          TPZVec<std::complex<float>_> *Eigenvalues,TPZFMatrix<std::complex<float>_> *Eigenvectors)

{
  long lVar1;
  int64_t j;
  long lVar2;
  ulong uVar3;
  long lVar4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 *local_128;
  undefined8 *local_f0;
  TPZVec<int> local_d8;
  int local_b8 [6];
  undefined **local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  
  lVar1 = (this->super_TPZBaseMatrix).fRow;
  local_f0 = &local_80;
  local_128 = (undefined8 *)0x0;
  TPZVec<int>::TPZVec(&local_d8,0);
  local_d8._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
  local_d8.fStore = local_b8;
  local_d8.fNElements = 0;
  local_d8.fNAlloc = 0;
  local_a0 = &PTR__TPZVec_01842418;
  local_98 = 0;
  uStack_90 = 0;
  local_88 = 0;
  if (lVar1 != 0) {
    uVar3 = lVar1 * lVar1;
    if (uVar3 < 10) goto LAB_00c3903f;
    local_128 = (undefined8 *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    memset(local_128,0,uVar3 * 8);
  }
  local_f0 = local_128;
LAB_00c3903f:
  local_40 = 0;
  uStack_38 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_70 = 0;
  uStack_68 = 0;
  local_80 = 0;
  uStack_78 = 0;
  if (0 < lVar1) {
    lVar4 = 0;
    do {
      lVar2 = 0;
      do {
        (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])(this,lVar4,lVar2);
        if ((lVar1 <= lVar4) || (lVar1 <= lVar2)) {
          TPZFMatrix<std::complex<float>_>::Error
                    ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
          pzinternal::DebugStopImpl
                    ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                     ,0x26d);
        }
        *(undefined4 *)(local_f0 + lVar1 * lVar2 + lVar4) = extraout_XMM0_Da;
        *(undefined4 *)((long)(local_f0 + lVar1 * lVar2 + lVar4) + 4) = extraout_XMM0_Db;
        lVar2 = lVar2 + 1;
      } while (lVar1 != lVar2);
      lVar4 = lVar4 + 1;
    } while (lVar4 != lVar1);
  }
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzmatrix.cpp",
             0x5a3);
}

Assistant:

bool TPZMatrix<TVar>::SolveEigensystemJacobi(int64_t &numiterations, REAL & tol, TPZVec<TVar> & Eigenvalues, TPZFMatrix<TVar> & Eigenvectors) const{
	
	int64_t NumIt = numiterations;
	REAL tolerance = tol;
	
#ifdef PZDEBUG2
	if (this->Rows() != this->Cols())
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. this->Rows = " << this->Rows() << " - this->Cols() = " << this->Cols() << endl;
		return false;
	}
	
	if (this->VerifySymmetry(1.e-8) == false)
	{
		PZError << __PRETTY_FUNCTION__ <<
		" - Jacobi method of computing eigensystem requires a symmetric square matrix. This matrix is not symmetric." << endl;
		return false;
	}
#endif
	
	const int64_t size = this->Rows();
	
	/** Making a copy of this */
	TPZFNMatrix<9,TVar> Matrix(size,size); //fast constructor in case of this is a stress or strain tensor.
	for(int64_t i = 0; i < size; i++) for(int64_t j = 0; j < size; j++) Matrix(i,j) = this->Get(i,j);
	
	/** Compute Eigenvalues *//////////////////////////////////////
	bool result = Matrix.SolveEigenvaluesJacobi(numiterations, tol, &Eigenvalues);
	if (result == false) return false;
	
	/** Compute Eigenvectors *//////////////////////////////////////
	TPZFNMatrix<3, TVar> VecIni(size,1,0.), VecIni_cp(size,1,0.);
	
	Eigenvectors.Resize(size, size);
	Eigenvectors.Zero();
	for(int64_t eigen = 0; eigen < size; eigen++)
	{
        for(int64_t i = 0; i < size; i++) VecIni.PutVal(i,0,rand());
		
        TPZFNMatrix<9,TVar> Matrix(*this);
		
        TVar answ = ReturnNearestValue(Eigenvalues[eigen], Eigenvalues,((TVar)1.E-5));
        TVar exp = answ - Eigenvalues[eigen];
        if((REAL)(fabs(exp)) > 1.E-5)
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (TVar)(Eigenvalues[eigen] - (TVar)(0.01 * fabs(exp))) );
        }
        else
        {
            for(int64_t i = 0; i < size; i++) Matrix.PutVal(i,i, this->GetVal(i,i) - (Eigenvalues[eigen] - TVar(0.01)) );
        }
		
        /** Normalizing Initial Eigenvec */
        REAL norm1 = 0.;
        for(int64_t i = 0; i < size; i++) norm1 += fabs(VecIni(i,0)) * fabs(VecIni(i,0)); norm1 = sqrt(norm1);
        for(int64_t i = 0; i < size; i++) VecIni(i,0) = VecIni(i,0)/(TVar)norm1;
		
        int64_t count = 0;
        double dif = 10., difTemp = 0.;
		
        while(dif > tolerance && count <= NumIt)
        {
			for(int64_t i = 0; i < size; i++) VecIni_cp(i,0) = VecIni(i,0);
			
			/** Estimating Eigenvec */
			Matrix.Solve_LU(&VecIni);
			
			/** Normalizing Final Eigenvec */
			REAL norm2 = 0.;
			for(int64_t i = 0; i < size; i++) norm2 += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
			norm2 = sqrt(norm2);
			
			difTemp = 0.;
			for(int64_t i = 0; i < size; i++)
			{
                VecIni(i,0) = VecIni(i,0)/(TVar)norm2;
                TVar exp = (VecIni_cp(i,0) - VecIni(i,0)) * (VecIni_cp(i,0) - VecIni(i,0));
                difTemp += fabs(exp);
			}
			dif = sqrt(difTemp);
			count++;
        }
		
        /** Copy values from AuxVector to Eigenvectors */
        for(int64_t i = 0; i < size; i++)
        {
			TVar val = VecIni(i,0);
			if((REAL)(fabs(val)) < 1.E-5) val = 0.;
			Eigenvectors(eigen,i) = val;
        }
		
#ifdef PZDEBUG2
        double norm = 0.;
        for(int64_t i = 0; i < size; i++) norm += fabs(VecIni(i,0)) * fabs(VecIni(i,0));
        if (fabs(norm - 1.) > 1.e-10)
        {
            PZError << __PRETTY_FUNCTION__ << endl;
        }
        if(count > NumIt-1)// O metodo nao convergiu !!!
        {
            PZError << __PRETTY_FUNCTION__ << endl;
#ifdef PZ_LOG
            {
                std::stringstream sout;
                Print("Matrix for SolveEigensystemJacobi did not converge",sout);
                LOGPZ_DEBUG(logger,sout.str());
            }
#endif
        }
#endif
	}
	
	return true;
	
}